

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::UsubBorrowCase::getInputValues
          (UsubBorrowCase *this,int numValues,void **values)

{
  ShaderType shaderType;
  Precision dataType;
  uint uVar1;
  uint uVar2;
  pointer pSVar3;
  void *pvVar4;
  void *pvVar5;
  deUint32 dVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int numValues_00;
  int easyCaseNdx;
  long lVar11;
  ulong uVar12;
  int iVar13;
  Random rnd;
  deRandom local_40;
  
  dVar6 = deStringHash((this->super_IntegerFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar6 ^ 0x235fac);
  pSVar3 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  shaderType = (pSVar3->varType).m_data.basic.type;
  dataType = (pSVar3->varType).m_data.basic.precision;
  uVar7 = glu::getDataTypeScalarSize(shaderType);
  bVar8 = (char)*(undefined4 *)(&DAT_0096b0b0 + (ulong)dataType * 4) - 1;
  uVar9 = (2 << (bVar8 & 0x1f)) - 1;
  pvVar4 = *values;
  pvVar5 = values[1];
  iVar13 = 0;
  numValues_00 = 0x96b0c0;
  lVar11 = 0;
  do {
    if (0 < (int)uVar7) {
      uVar1 = (&DAT_0096b0c0)[lVar11 * 2];
      uVar2 = (&DAT_0096b0c4)[lVar11 * 2];
      uVar12 = (ulong)uVar7;
      iVar10 = iVar13;
      do {
        *(uint *)((long)pvVar4 + (long)iVar10 * 4) = uVar1 & uVar9;
        *(uint *)((long)pvVar5 + (long)iVar10 * 4) = uVar2 & uVar9;
        iVar10 = iVar10 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    lVar11 = lVar11 + 1;
    iVar13 = iVar13 + uVar7;
  } while (lVar11 != 6);
  if (shaderType - 0x1b < 4) {
    uVar9 = 1 << (bVar8 & 0x1f);
    iVar13 = 0;
    iVar10 = 0;
    do {
      uVar12 = (ulong)uVar7;
      numValues_00 = iVar13;
      if (0 < (int)uVar7) {
        do {
          lVar11 = (long)numValues_00;
          uVar1 = *(uint *)((long)pvVar4 + lVar11 * 4);
          *(uint *)((long)pvVar4 + lVar11 * 4) = (uVar1 & uVar9) * -2 | uVar1;
          uVar1 = *(uint *)((long)pvVar5 + lVar11 * 4);
          *(uint *)((long)pvVar5 + lVar11 * 4) = (uVar1 & uVar9) * -2 | uVar1;
          numValues_00 = numValues_00 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      iVar10 = iVar10 + 1;
      iVar13 = iVar13 + uVar7;
    } while (iVar10 != 6);
  }
  anon_unknown_3::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar4,
             (deUint32 *)(ulong)(numValues - 6U),numValues_00);
  anon_unknown_3::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar5,
             (deUint32 *)(ulong)(numValues - 6U),numValues_00);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(getName()) ^ 0x235facu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			integerMask		= getLowBitMask(integerLength);
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		deUint32*				in0				= (deUint32*)values[0];
		deUint32*				in1				= (deUint32*)values[1];

		const struct
		{
			deUint32	x;
			deUint32	y;
		} easyCases[] =
		{
			{ 0x00000000u,	0x00000000u },
			{ 0x00000001u,	0x00000001u },
			{ 0x00000001u,	0x00000002u },
			{ 0x00000001u,	0xffffffffu },
			{ 0xfffffffeu,	0xffffffffu },
			{ 0xffffffffu,	0xffffffffu },
		};

		// generate integers with proper bit count
		for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				in0[easyCaseNdx*scalarSize + compNdx] = easyCases[easyCaseNdx].x & integerMask;
				in1[easyCaseNdx*scalarSize + compNdx] = easyCases[easyCaseNdx].y & integerMask;
			}
		}

		// convert to signed
		if (isSigned)
		{
			for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					in0[easyCaseNdx*scalarSize + compNdx] = extendSignTo32(in0[easyCaseNdx*scalarSize + compNdx], integerLength);
					in1[easyCaseNdx*scalarSize + compNdx] = extendSignTo32(in1[easyCaseNdx*scalarSize + compNdx], integerLength);
				}
			}
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, in0, numValues - DE_LENGTH_OF_ARRAY(easyCases));
		generateRandomInputData(rnd, m_shaderType, type, precision, in1, numValues - DE_LENGTH_OF_ARRAY(easyCases));
	}